

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O2

void __thiscall jpge::jpeg_encoder::emit_jfif_app0(jpeg_encoder *this)

{
  emit_marker(this,0xe0);
  emit_word(this,0x10);
  emit_byte(this,'J');
  emit_byte(this,'F');
  emit_byte(this,'I');
  emit_byte(this,'F');
  emit_byte(this,'\0');
  emit_byte(this,'\x01');
  emit_byte(this,'\x01');
  emit_byte(this,'\0');
  emit_word(this,1);
  emit_word(this,1);
  emit_byte(this,'\0');
  emit_byte(this,'\0');
  return;
}

Assistant:

void jpeg_encoder::emit_jfif_app0()
{
  emit_marker(M_APP0);
  emit_word(2 + 4 + 1 + 2 + 1 + 2 + 2 + 1 + 1);
  emit_byte(0x4A); emit_byte(0x46); emit_byte(0x49); emit_byte(0x46); /* Identifier: ASCII "JFIF" */
  emit_byte(0);
  emit_byte(1);      /* Major version */
  emit_byte(1);      /* Minor version */
  emit_byte(0);      /* Density unit */
  emit_word(1);
  emit_word(1);
  emit_byte(0);      /* No thumbnail image */
  emit_byte(0);
}